

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

size_t (anonymous_namespace)::miniz::mz_zip_mem_read_func
                 (void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  ulong in_RCX;
  void *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  size_t s;
  mz_zip_archive *pZip;
  ulong local_40;
  size_t local_38;
  
  if (in_RSI < *in_RDI) {
    local_40 = in_RCX;
    if (*in_RDI - in_RSI < in_RCX) {
      local_40 = *in_RDI - in_RSI;
    }
    local_38 = local_40;
  }
  else {
    local_38 = 0;
  }
  memcpy(in_RDX,(void *)(*(long *)(in_RDI[0xb] + 0x68) + in_RSI),local_38);
  return local_38;
}

Assistant:

static size_t mz_zip_mem_read_func(void *pOpaque, mz_uint64 file_ofs,
                                   void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  size_t s = (file_ofs >= pZip->m_archive_size)
                 ? 0
                 : (size_t)MZ_MIN(pZip->m_archive_size - file_ofs, n);
  memcpy(pBuf, (const mz_uint8 *)pZip->m_pState->m_pMem + file_ofs, s);
  return s;
}